

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

uint8_t * __thiscall
google::protobuf::internal::ExtensionSet::InternalSerializeMessage
          (ExtensionSet *this,int number,MessageLite *prototype,uint8_t *target,
          EpsCopyOutputStream *stream)

{
  anon_union_8_9_fdc4a54a_for_Extension_0 this_00;
  int field_number;
  int cached_size;
  anon_enum_32 *v1;
  anon_enum_32 *v2;
  char *pcVar1;
  LogMessage *pLVar2;
  CppType *v1_00;
  CppType *v2_00;
  MessageLite *msg;
  Voidify local_a9;
  CppType local_a8;
  CppType local_a4;
  Nullable<const_char_*> local_a0;
  LogMessage local_98;
  Voidify local_81;
  anon_enum_32 local_80;
  anon_enum_32 local_7c;
  Nullable<const_char_*> local_78;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  byte local_59;
  LogMessage local_58;
  Voidify local_41;
  Extension *local_40;
  Extension *extension;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  MessageLite *prototype_local;
  ExtensionSet *pEStack_18;
  int number_local;
  ExtensionSet *this_local;
  
  extension = (Extension *)stream;
  stream_local = (EpsCopyOutputStream *)target;
  target_local = (uint8_t *)prototype;
  prototype_local._4_4_ = number;
  pEStack_18 = this;
  local_40 = FindOrNull(this,number);
  local_59 = 0;
  if (local_40 == (Extension *)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
               ,0x217,"extension != nullptr");
    local_59 = 1;
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_58);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar2,(char (*) [12])"not present");
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_41,pLVar2);
  }
  if ((local_59 & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_58);
  }
  local_7c = (anon_enum_32)((local_40->is_repeated & 1U) == 0);
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<google::protobuf::internal::(anonymous_namespace)::__1>(&local_7c);
  local_80 = OPTIONAL_FIELD;
  v2 = absl::lts_20250127::log_internal::
       GetReferenceableValue<google::protobuf::internal::(anonymous_namespace)::__1>(&local_80);
  local_78 = absl::lts_20250127::log_internal::
             Check_EQImpl<google::protobuf::internal::(anonymous_namespace)::__1,google::protobuf::internal::(anonymous_namespace)::__1>
                       (v1,v2,
                        "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == OPTIONAL_FIELD"
                       );
  if (local_78 != (Nullable<const_char_*>)0x0) {
    pcVar1 = absl::lts_20250127::implicit_cast<char_const*>(local_78);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_98,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
               ,0x218,pcVar1);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_98);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_81,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_98);
  }
  local_a4 = anon_unknown_59::cpp_type(local_40->type);
  v1_00 = absl::lts_20250127::log_internal::
          GetReferenceableValue<google::protobuf::internal::WireFormatLite::CppType>(&local_a4);
  local_a8 = CPPTYPE_MESSAGE;
  v2_00 = absl::lts_20250127::log_internal::
          GetReferenceableValue<google::protobuf::internal::WireFormatLite::CppType>(&local_a8);
  local_a0 = absl::lts_20250127::log_internal::
             Check_EQImpl<google::protobuf::internal::WireFormatLite::CppType,google::protobuf::internal::WireFormatLite::CppType>
                       (v1_00,v2_00,"cpp_type((*extension).type) == WireFormatLite::CPPTYPE_MESSAGE"
                       );
  field_number = prototype_local._4_4_;
  if (local_a0 != (Nullable<const_char_*>)0x0) {
    pcVar1 = absl::lts_20250127::implicit_cast<char_const*>(local_a0);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&msg,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
               ,0x218,pcVar1);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream((LogMessage *)&msg);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_a9,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&msg);
  }
  if (((byte)local_40->field_0xa >> 2 & 1) == 0) {
    this_00 = local_40->field_0;
    cached_size = MessageLite::GetCachedSize(this_00);
    this_local = (ExtensionSet *)
                 WireFormatLite::InternalWriteMessage
                           (field_number,(MessageLite *)this_00,cached_size,(uint8_t *)stream_local,
                            (EpsCopyOutputStream *)extension);
  }
  else {
    this_local = (ExtensionSet *)
                 (**(code **)(**(long **)&(local_40->field_0).int32_t_value + 0xa0))
                           (*(long **)&(local_40->field_0).int32_t_value,target_local,
                            prototype_local._4_4_,stream_local,extension);
  }
  return (uint8_t *)this_local;
}

Assistant:

uint8_t* ExtensionSet::InternalSerializeMessage(
    int number, const MessageLite* prototype, uint8_t* target,
    io::EpsCopyOutputStream* stream) const {
  const Extension* extension = FindOrNull(number);
  ABSL_CHECK(extension != nullptr) << "not present";
  ABSL_DCHECK_TYPE(*extension, OPTIONAL_FIELD, MESSAGE);

  if (extension->is_lazy) {
    return extension->ptr.lazymessage_value->WriteMessageToArray(
        prototype, number, target, stream);
  }

  const auto* msg = extension->ptr.message_value;
  return WireFormatLite::InternalWriteMessage(
      number, *msg, msg->GetCachedSize(), target, stream);
}